

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_env(App *this)

{
  bool bVar1;
  byte bVar2;
  reference this_00;
  pointer pOVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  element_type *peVar7;
  byte local_111;
  string local_f0;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_d0;
  App_p *sub;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_1;
  allocator local_79;
  string local_78 [32];
  string local_58 [8];
  string ename_string;
  char *buffer;
  Option_p *opt;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  App *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                     *)&opt), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&__end2);
    pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
    sVar4 = Option::count(pOVar3);
    if (sVar4 == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ename_string.field_2._8_8_ = 0;
        ::std::__cxx11::string::string(local_58);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
        pcVar6 = (char *)::std::__cxx11::string::c_str();
        pcVar6 = getenv(pcVar6);
        ename_string.field_2._8_8_ = pcVar6;
        if (pcVar6 != (char *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_78,pcVar6,&local_79);
          ::std::__cxx11::string::operator=(local_58,local_78);
          ::std::__cxx11::string::~string(local_78);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (this_00);
          ::std::__cxx11::string::string((string *)&__range2_1,local_58);
          Option::add_result(pOVar3,(string *)&__range2_1);
          ::std::__cxx11::string::~string((string *)&__range2_1);
        }
        ::std::__cxx11::string::~string(local_58);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
  sub = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)&sub), bVar1) {
    local_d0 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*(&__end2_1);
    peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    get_name_abi_cxx11_(&local_f0,peVar7);
    bVar2 = ::std::__cxx11::string::empty();
    local_111 = 1;
    if ((bVar2 & 1) == 0) {
      peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_d0);
      local_111 = peVar7->immediate_callback_ ^ 0xff;
    }
    ::std::__cxx11::string::~string((string *)&local_f0);
    if ((local_111 & 1) != 0) {
      peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_d0);
      _process_env(peVar7);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void _process_env() {
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        for(App_p &sub : subcommands_) {
            if(sub->get_name().empty() || !sub->immediate_callback_)
                sub->_process_env();
        }
    }